

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O3

x86_reg X86_insn_reg_intel(uint id)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (insn_regs_intel[lVar1].insn == id) {
      return insn_regs_intel[lVar1].reg;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x61);
  return X86_REG_INVALID;
}

Assistant:

x86_reg X86_insn_reg_intel(unsigned int id)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_intel); i++) {
		if (insn_regs_intel[i].insn == id) {
			return insn_regs_intel[i].reg;
		}
	}

	// not found
	return 0;
}